

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.cpp
# Opt level: O0

void __thiscall SpanList::pop(SpanList *this,Span *pSpan)

{
  Span *pSpan_local;
  SpanList *this_local;
  
  if ((this->list != (Span *)0x0) && (pSpan != (Span *)0x0)) {
    if (this->list == pSpan) {
      popFront(this);
    }
    else {
      pSpan->prev->next = pSpan->next;
      pSpan->next->prev = pSpan->prev;
    }
  }
  return;
}

Assistant:

void SpanList::pop(Span *pSpan) {
  // 当链表为空 时
  if (list == nullptr || pSpan == nullptr) {
    return;
  }
  if (list == pSpan) { // 当pSpan是链表头时, 可调用其他接口直接实现.
                       // 这种情况也包含了只有一个元素的情况
    this->popFront();
  } else { // 当节点在链表的其他部位时
    pSpan->prev->next = pSpan->next;
    pSpan->next->prev = pSpan->prev;
  }
}